

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

int duckdb_shell_sqlite3_create_function
              (sqlite3 *db,char *zFunctionName,int nArg,int eTextRep,void *pApp,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  size_t sVar3;
  reference pvVar4;
  pointer this_00;
  type context;
  int iVar5;
  ulong __n;
  size_type __n_00;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  string fname;
  scalar_function_t udf_sqlite3;
  LogicalType local_150;
  LogicalType local_138;
  LogicalType local_120;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  _Any_data local_d8;
  code *local_c8;
  _Any_data local_b8;
  code *local_a8;
  LogicalType local_98;
  LogicalType local_80;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  string local_50;
  
  iVar5 = 0x15;
  if (((-2 < nArg) && (zFunctionName != (char *)0x0)) &&
     ((xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
      xFinal != (_func_void_sqlite3_context_ptr *)0x0) ||
      xFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)) {
    local_f8 = local_e8;
    sVar3 = strlen(zFunctionName);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,zFunctionName,zFunctionName + sVar3);
    if (xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
      iVar5 = 0x15;
    }
    else {
      duckdb::SQLiteUDFWrapper::CreateSQLiteScalarFunction
                ((scalar_function_t *)&local_b8,xFunc,db,pApp);
      duckdb::LogicalType::LogicalType(&local_120,INVALID);
      if (nArg == -1) {
        duckdb::LogicalType::LogicalType(&local_150,ANY);
        duckdb::LogicalType::~LogicalType(&local_150);
        nArg = 0;
      }
      __n = (ulong)(uint)nArg;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_150,__n
                 ,(allocator_type *)&local_138);
      if (__n != 0) {
        __n_00 = 0;
        do {
          duckdb::LogicalType::LogicalType(&local_138,ANY);
          pvVar4 = duckdb::vector<duckdb::LogicalType,_true>::operator[]
                             ((vector<duckdb::LogicalType,_true> *)&local_150,__n_00);
          _Var2._M_pi = local_138.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar1 = local_138.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pvVar4->id_ = local_138.id_;
          pvVar4->physical_type_ = local_138.physical_type_;
          uVar6 = *(undefined4 *)
                   &(pvVar4->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar7 = *(undefined4 *)
                   ((long)&(pvVar4->type_info_).internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 4);
          uVar8 = *(undefined4 *)
                   &(pvVar4->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          uVar9 = *(undefined4 *)
                   ((long)&(pvVar4->type_info_).internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 4);
          (pvVar4->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar4->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_138.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_138.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (pvVar4->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
          (pvVar4->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
          (pvVar4->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               _Var2._M_pi;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_108 = uVar6;
            uStack_104 = uVar7;
            uStack_100 = uVar8;
            uStack_fc = uVar9;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            uVar6 = local_108;
            uVar7 = uStack_104;
            uVar8 = uStack_100;
            uVar9 = uStack_fc;
          }
          _Var2._M_pi = local_138.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_138.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)CONCAT44(uVar7,uVar6);
          local_138.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = uVar9;
          local_138.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = uVar8;
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          duckdb::LogicalType::~LogicalType(&local_138);
          __n_00 = __n_00 + 1;
        } while (__n != __n_00);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_f8,local_f8 + local_f0);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_68,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_150);
      duckdb::LogicalType::LogicalType(&local_80,VARCHAR);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               &local_d8,
               (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               &local_b8);
      this_00 = duckdb::
                unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                operator->(&db->con);
      context = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*(&this_00->context);
      duckdb::LogicalType::LogicalType(&local_98,&local_120);
      duckdb::UDFWrapper::RegisterFunction
                (&local_50,(vector<duckdb::LogicalType,_true> *)&local_68,&local_80,
                 (scalar_function_t *)&local_d8,context,&local_98);
      duckdb::LogicalType::~LogicalType(&local_98);
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,__destroy_functor);
      }
      duckdb::LogicalType::~LogicalType(&local_80);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_150);
      duckdb::LogicalType::~LogicalType(&local_120);
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      iVar5 = 0;
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
  }
  return iVar5;
}

Assistant:

int sqlite3_create_function(sqlite3 *db, const char *zFunctionName, int nArg, int eTextRep, void *pApp,
                            void (*xFunc)(sqlite3_context *, int, sqlite3_value **),
                            void (*xStep)(sqlite3_context *, int, sqlite3_value **),
                            void (*xFinal)(sqlite3_context *)) {
	if ((!xFunc && !xStep && !xFinal) || !zFunctionName || nArg < -1) {
		return SQLITE_MISUSE;
	}
	string fname = string(zFunctionName);

	// Scalar function
	if (!xFunc) {
		return SQLITE_MISUSE;
	}
	auto udf_sqlite3 = SQLiteUDFWrapper::CreateSQLiteScalarFunction(xFunc, db, pApp);
	LogicalType varargs = LogicalType::INVALID;
	if (nArg == -1) {
		varargs = LogicalType::ANY;
		nArg = 0;
	}

	duckdb::vector<LogicalType> argv_types(nArg);
	for (idx_t i = 0; i < (idx_t)nArg; ++i) {
		argv_types[i] = LogicalType::ANY;
	}

	UDFWrapper::RegisterFunction(fname, argv_types, LogicalType::VARCHAR, udf_sqlite3, *(db->con->context), varargs);
	return SQLITE_OK;
}